

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.c
# Opt level: O0

char * dsa_cache_str(ssh_key *key)

{
  strbuf *sb_00;
  strbuf *sb;
  dsa_key *dsa;
  ssh_key *key_local;
  
  sb_00 = strbuf_new();
  if (key[-5].vt == (ssh_keyalg *)0x0) {
    strbuf_free(sb_00);
    key_local = (ssh_key *)0x0;
  }
  else {
    append_hex_to_strbuf(sb_00,(mp_int *)key[-5].vt);
    append_hex_to_strbuf(sb_00,(mp_int *)key[-4].vt);
    append_hex_to_strbuf(sb_00,(mp_int *)key[-3].vt);
    append_hex_to_strbuf(sb_00,(mp_int *)key[-2].vt);
    key_local = (ssh_key *)strbuf_to_str(sb_00);
  }
  return (char *)key_local;
}

Assistant:

static char *dsa_cache_str(ssh_key *key)
{
    struct dsa_key *dsa = container_of(key, struct dsa_key, sshk);
    strbuf *sb = strbuf_new();

    if (!dsa->p) {
        strbuf_free(sb);
        return NULL;
    }

    append_hex_to_strbuf(sb, dsa->p);
    append_hex_to_strbuf(sb, dsa->q);
    append_hex_to_strbuf(sb, dsa->g);
    append_hex_to_strbuf(sb, dsa->y);

    return strbuf_to_str(sb);
}